

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::dispatcher_template_t
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,disp_params_t *params)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  
  so_5::dispatcher_t::dispatcher_t((dispatcher_t *)this);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__dispatcher_template_t_002889f8;
  (this->m_params).
  super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::active_group::disp_params_t>.m_flag =
       (params->
       super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::active_group::disp_params_t>).
       m_flag;
  *(undefined8 *)&(this->m_params).m_queue_params.m_lock_factory.super__Function_base._M_functor = 0
  ;
  *(undefined8 *)
   ((long)&(this->m_params).m_queue_params.m_lock_factory.super__Function_base._M_functor + 8) = 0;
  (this->m_params).m_queue_params.m_lock_factory.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->m_params).m_queue_params.m_lock_factory._M_invoker =
       (params->m_queue_params).m_lock_factory._M_invoker;
  if ((params->m_queue_params).m_lock_factory.super__Function_base._M_manager != (_Manager_type)0x0)
  {
    uVar2 = *(undefined8 *)
             ((long)&(params->m_queue_params).m_lock_factory.super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_params).m_queue_params.m_lock_factory.super__Function_base._M_functor =
         *(undefined8 *)&(params->m_queue_params).m_lock_factory.super__Function_base._M_functor;
    *(undefined8 *)
     ((long)&(this->m_params).m_queue_params.m_lock_factory.super__Function_base._M_functor + 8) =
         uVar2;
    (this->m_params).m_queue_params.m_lock_factory.super__Function_base._M_manager =
         (params->m_queue_params).m_lock_factory.super__Function_base._M_manager;
    (params->m_queue_params).m_lock_factory.super__Function_base._M_manager = (_Manager_type)0x0;
    (params->m_queue_params).m_lock_factory._M_invoker = (_Invoker_type)0x0;
  }
  p_Var1 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_shutdown_started = false;
  *(undefined1 (*) [32])&(this->m_lock).super___mutex_base._M_mutex = ZEXT432(0) << 0x40;
  (this->m_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  stats::manually_registered_source_t::manually_registered_source_t
            (&(this->m_data_source).super_manually_registered_source_t);
  (this->m_data_source).super_manually_registered_source_t.super_source_t._vptr_source_t =
       (_func_int **)&PTR_distribute_00288a60;
  (this->m_data_source).m_dispatcher = this;
  (this->m_data_source).m_base_prefix.m_value[0] = '\0';
  return;
}

Assistant:

dispatcher_template_t( disp_params_t params )
			:	m_params{ std::move(params) }
			,	m_data_source( self() )
			{}